

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O2

Result __thiscall
wabt::LexerSourceLineFinder::GetSourceLine
          (LexerSourceLineFinder *this,Location *loc,Offset max_line_length,
          SourceLine *out_source_line)

{
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var1;
  unsigned_long uVar2;
  Result RVar3;
  int iVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  undefined1 auVar7 [8];
  Offset in_R8;
  Enum EVar8;
  OffsetRange OVar9;
  undefined1 auStack_68 [8];
  OffsetRange original;
  vector<char,_std::allocator<char>_> read_line;
  
  uVar5 = *(unsigned_long *)((long)&(loc->field_1).field_1.offset + 4);
  auStack_68 = (undefined1  [8])0x0;
  original.start = 0;
  RVar3 = GetLineOffsets(this,(loc->field_1).field_0.line,(OffsetRange *)auStack_68);
  uVar2 = original.start;
  auVar7 = auStack_68;
  if (RVar3.enum_ == Error) {
    EVar8 = Error;
  }
  else {
    OVar9.end = uVar5;
    OVar9.start = original.start;
    OVar9 = ClampSourceLineOffsets
                      ((LexerSourceLineFinder *)auStack_68,OVar9,(ColumnRange)max_line_length,in_R8)
    ;
    uVar5 = OVar9.end;
    out_source_line->column_offset = (int)OVar9.start - auVar7._0_4_;
    if ((undefined1  [8])OVar9.start != auVar7) {
      std::__cxx11::string::append((string *)out_source_line,"...");
      auVar7 = (undefined1  [8])
               ((long)&(((LexerSourceLineFinder *)OVar9.start)->source_)._M_t.
                       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                       .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl + 3);
    }
    uVar6 = uVar5 - 3;
    if (uVar2 == uVar5) {
      uVar6 = uVar5;
    }
    original.end = 0;
    _Var1._M_head_impl =
         (this->source_)._M_t.
         super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
         super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
         super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
    iVar4 = (*(_Var1._M_head_impl)->_vptr_LexerSource[5])(_Var1._M_head_impl,auVar7,uVar6);
    if (iVar4 == 1) {
      EVar8 = Error;
    }
    else {
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                ((string *)out_source_line,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)original.end,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)0x0);
      EVar8 = Ok;
      if (uVar2 != uVar5) {
        std::__cxx11::string::append((string *)out_source_line,"...");
      }
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&original.end);
  }
  return (Result)EVar8;
}

Assistant:

Result LexerSourceLineFinder::GetSourceLine(const Location& loc,
                                            Offset max_line_length,
                                            SourceLine* out_source_line) {
  ColumnRange column_range(loc.first_column, loc.last_column);
  OffsetRange original;
  CHECK_RESULT(GetLineOffsets(loc.line, &original));

  OffsetRange clamped =
      ClampSourceLineOffsets(original, column_range, max_line_length);
  bool has_start_ellipsis = original.start != clamped.start;
  bool has_end_ellipsis = original.end != clamped.end;

  out_source_line->column_offset = clamped.start - original.start;

  if (has_start_ellipsis) {
    out_source_line->line += "...";
    clamped.start += 3;
  }
  if (has_end_ellipsis) {
    clamped.end -= 3;
  }

  std::vector<char> read_line;
  CHECK_RESULT(source_->ReadRange(clamped, &read_line));
  out_source_line->line.append(read_line.begin(), read_line.end());

  if (has_end_ellipsis) {
    out_source_line->line += "...";
  }

  return Result::Ok;
}